

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# katajainen.c
# Opt level: O0

int ZopfliLengthLimitedCodeLengths(size_t *frequencies,int n,int maxbits,uint *bitlengths)

{
  Node *leaves_00;
  Node *__ptr;
  Node *(*lists_00) [2];
  Node *(*in_RCX) [2];
  int in_EDX;
  int in_ESI;
  long in_RDI;
  uint *unaff_retaddr;
  Node *leaves;
  Node *(*lists) [2];
  Node *nodes;
  int numBoundaryPMRuns;
  int numsymbols;
  int i;
  NodePool pool;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  int numsymbols_00;
  int iVar1;
  int numsymbols_01;
  NodePool leaves_01;
  int local_18;
  int local_4;
  
  numsymbols_00 = 0;
  leaves_00 = (Node *)malloc((long)in_ESI * 0x18);
  for (iVar1 = 0; iVar1 < in_ESI; iVar1 = iVar1 + 1) {
    *(undefined4 *)((long)*in_RCX + (long)iVar1 * 4) = 0;
  }
  for (iVar1 = 0; iVar1 < in_ESI; iVar1 = iVar1 + 1) {
    if (*(long *)(in_RDI + (long)iVar1 * 8) != 0) {
      leaves_00[numsymbols_00].weight = *(size_t *)(in_RDI + (long)iVar1 * 8);
      leaves_00[numsymbols_00].count = iVar1;
      numsymbols_00 = numsymbols_00 + 1;
    }
  }
  if (1 << ((byte)in_EDX & 0x1f) < numsymbols_00) {
    free(leaves_00);
    local_4 = 1;
  }
  else if (numsymbols_00 == 0) {
    free(leaves_00);
    local_4 = 0;
  }
  else if (numsymbols_00 == 1) {
    *(undefined4 *)((long)*in_RCX + (long)leaves_00->count * 4) = 1;
    free(leaves_00);
    local_4 = 0;
  }
  else if (numsymbols_00 == 2) {
    *(int *)((long)*in_RCX + (long)leaves_00->count * 4) =
         *(int *)((long)*in_RCX + (long)leaves_00->count * 4) + 1;
    *(int *)((long)*in_RCX + (long)leaves_00[1].count * 4) =
         *(int *)((long)*in_RCX + (long)leaves_00[1].count * 4) + 1;
    free(leaves_00);
    local_4 = 0;
  }
  else {
    for (iVar1 = 0; iVar1 < numsymbols_00; iVar1 = iVar1 + 1) {
      if (0x7fffffffffffff < leaves_00[iVar1].weight) {
        free(leaves_00);
        return 1;
      }
      leaves_00[iVar1].weight = leaves_00[iVar1].weight << 9 | (long)leaves_00[iVar1].count;
    }
    qsort(leaves_00,(long)numsymbols_00,0x18,LeafComparator);
    for (iVar1 = 0; iVar1 < numsymbols_00; iVar1 = iVar1 + 1) {
      leaves_00[iVar1].weight = leaves_00[iVar1].weight >> 9;
    }
    local_18 = in_EDX;
    if (numsymbols_00 + -1 < in_EDX) {
      local_18 = numsymbols_00 + -1;
    }
    __ptr = (Node *)malloc((long)(local_18 * 2 * numsymbols_00) * 0x18);
    leaves_01.next = __ptr;
    lists_00 = (Node *(*) [2])malloc((long)local_18 << 4);
    InitLists((NodePool *)CONCAT44(iVar1,numsymbols_00),
              (Node *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
              (int)((ulong)__ptr >> 0x20),lists_00);
    iVar1 = numsymbols_00 * 2 + -4;
    for (numsymbols_01 = 0; numsymbols_01 < iVar1 + -1; numsymbols_01 = numsymbols_01 + 1) {
      BoundaryPM(in_RCX,leaves_01.next,numsymbols_01,
                 (NodePool *)CONCAT44(iVar1,in_stack_ffffffffffffffc8),(int)((ulong)__ptr >> 0x20));
    }
    BoundaryPMFinal(lists_00,leaves_00,numsymbols_00,(NodePool *)&stack0xffffffffffffffd8,
                    local_18 + -1);
    ExtractBitLengths((Node *)lists,leaves,unaff_retaddr);
    free(lists_00);
    free(leaves_00);
    free(__ptr);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int ZopfliLengthLimitedCodeLengths(
    const size_t* frequencies, int n, int maxbits, unsigned* bitlengths) {
  NodePool pool;
  int i;
  int numsymbols = 0;  /* Amount of symbols with frequency > 0. */
  int numBoundaryPMRuns;
  Node* nodes;

  /* Array of lists of chains. Each list requires only two lookahead chains at
  a time, so each list is a array of two Node*'s. */
  Node* (*lists)[2];

  /* One leaf per symbol. Only numsymbols leaves will be used. */
  Node* leaves = (Node*)malloc(n * sizeof(*leaves));

  /* Initialize all bitlengths at 0. */
  for (i = 0; i < n; i++) {
    bitlengths[i] = 0;
  }

  /* Count used symbols and place them in the leaves. */
  for (i = 0; i < n; i++) {
    if (frequencies[i]) {
      leaves[numsymbols].weight = frequencies[i];
      leaves[numsymbols].count = i;  /* Index of symbol this leaf represents. */
      numsymbols++;
    }
  }

  /* Check special cases and error conditions. */
  if ((1 << maxbits) < numsymbols) {
    free(leaves);
    return 1;  /* Error, too few maxbits to represent symbols. */
  }
  if (numsymbols == 0) {
    free(leaves);
    return 0;  /* No symbols at all. OK. */
  }
  if (numsymbols == 1) {
    bitlengths[leaves[0].count] = 1;
    free(leaves);
    return 0;  /* Only one symbol, give it bitlength 1, not 0. OK. */
  }
  if (numsymbols == 2) {
    bitlengths[leaves[0].count]++;
    bitlengths[leaves[1].count]++;
    free(leaves);
    return 0;
  }

  /* Sort the leaves from lightest to heaviest. Add count into the same
  variable for stable sorting. */
  for (i = 0; i < numsymbols; i++) {
    if (leaves[i].weight >=
        ((size_t)1 << (sizeof(leaves[0].weight) * CHAR_BIT - 9))) {
      free(leaves);
      return 1;  /* Error, we need 9 bits for the count. */
    }
    leaves[i].weight = (leaves[i].weight << 9) | leaves[i].count;
  }
  qsort(leaves, numsymbols, sizeof(Node), LeafComparator);
  for (i = 0; i < numsymbols; i++) {
    leaves[i].weight >>= 9;
  }

  if (numsymbols - 1 < maxbits) {
    maxbits = numsymbols - 1;
  }

  /* Initialize node memory pool. */
  nodes = (Node*)malloc(maxbits * 2 * numsymbols * sizeof(Node));
  pool.next = nodes;

  lists = (Node* (*)[2])malloc(maxbits * sizeof(*lists));
  InitLists(&pool, leaves, maxbits, lists);

  /* In the last list, 2 * numsymbols - 2 active chains need to be created. Two
  are already created in the initialization. Each BoundaryPM run creates one. */
  numBoundaryPMRuns = 2 * numsymbols - 4;
  for (i = 0; i < numBoundaryPMRuns - 1; i++) {
    BoundaryPM(lists, leaves, numsymbols, &pool, maxbits - 1);
  }
  BoundaryPMFinal(lists, leaves, numsymbols, &pool, maxbits - 1);

  ExtractBitLengths(lists[maxbits - 1][1], leaves, bitlengths);

  free(lists);
  free(leaves);
  free(nodes);
  return 0;  /* OK. */
}